

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int trex_newnode(TRex *exp,TRexNodeType type)

{
  int iVar1;
  TRexNode *pTVar2;
  int newid;
  TRexNode n;
  TRexNodeType type_local;
  TRex *exp_local;
  
  n.type = -1;
  if (type == 0x102) {
    n.type = exp->_nsubexpr;
    exp->_nsubexpr = n.type + 1;
  }
  if (exp->_nallocated < exp->_nsize + 1) {
    exp->_nallocated = exp->_nallocated << 1;
    pTVar2 = (TRexNode *)argtable3_xrealloc(exp->_nodes,(long)exp->_nallocated << 4);
    exp->_nodes = pTVar2;
  }
  iVar1 = exp->_nsize;
  exp->_nsize = iVar1 + 1;
  pTVar2 = exp->_nodes + iVar1;
  pTVar2->type = type;
  pTVar2->left = 0xffffffff;
  pTVar2->right = n.type;
  pTVar2->next = 0xffffffff;
  return exp->_nsize + -1;
}

Assistant:

static int trex_newnode(TRex* exp, TRexNodeType type) {
    TRexNode n;
    int newid;
    n.type = type;
    n.next = n.right = n.left = -1;
    if (type == OP_EXPR)
        n.right = exp->_nsubexpr++;
    if (exp->_nallocated < (exp->_nsize + 1)) {
        exp->_nallocated *= 2;
        exp->_nodes = (TRexNode*)xrealloc(exp->_nodes, (size_t)exp->_nallocated * sizeof(TRexNode));
    }
    exp->_nodes[exp->_nsize++] = n;
    newid = exp->_nsize - 1;
    return (int)newid;
}